

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free_window(nk_context *ctx,nk_window *win)

{
  nk_page_data *pnVar1;
  bool bVar2;
  nk_page_element *pe;
  nk_page_data *pd;
  nk_table *it;
  nk_table *n;
  nk_window *win_local;
  nk_context *ctx_local;
  
  pd = (nk_page_data *)win->tables;
  if ((win->popup).win != (nk_window *)0x0) {
    nk_free_window(ctx,(win->popup).win);
    (win->popup).win = (nk_window *)0x0;
  }
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  while (pd != (nk_page_data *)0x0) {
    pnVar1 = (nk_page_data *)(pd->tbl).next;
    nk_remove_table(win,&pd->tbl);
    nk_free_table(ctx,&pd->tbl);
    bVar2 = pd == (nk_page_data *)win->tables;
    pd = pnVar1;
    if (bVar2) {
      win->tables = (nk_table *)pnVar1;
    }
  }
  nk_free_page_element(ctx,(nk_page_element *)win);
  return;
}

Assistant:

NK_INTERN void
nk_free_window(struct nk_context *ctx, struct nk_window *win)
{
    /* unlink windows from list */
    struct nk_table *n, *it = win->tables;
    if (win->popup.win) {
        nk_free_window(ctx, win->popup.win);
        win->popup.win = 0;
    }
    win->next = 0;
    win->prev = 0;

    while (it) {
        /*free window state tables */
        n = it->next;
        nk_remove_table(win, it);
        nk_free_table(ctx, it);
        if (it == win->tables)
            win->tables = n;
        it = n;
    }

    /* link windows into freelist */
    {union nk_page_data *pd = NK_CONTAINER_OF(win, union nk_page_data, win);
    struct nk_page_element *pe = NK_CONTAINER_OF(pd, struct nk_page_element, data);
    nk_free_page_element(ctx, pe);}
}